

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleType.cpp
# Opt level: O0

void __thiscall hdc::DoubleType::DoubleType(DoubleType *this,Token *token)

{
  Token *token_local;
  DoubleType *this_local;
  
  PrimitiveType::PrimitiveType(&this->super_PrimitiveType);
  (this->super_PrimitiveType).super_Type.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_00220258;
  Token::Token(&this->token);
  Token::operator=(&this->token,token);
  (this->super_PrimitiveType).super_Type.super_ASTNode.kind = AST_DOUBLE_TYPE;
  return;
}

Assistant:

DoubleType::DoubleType(Token& token) {
    this->token = token;
    this->kind = AST_DOUBLE_TYPE;
}